

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apted_tree_index_impl.h
# Opt level: O0

double __thiscall
ted::APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>::gted
          (APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
           *this,TreeIndexAPTED *t1,int t1_current_subtree,TreeIndexAPTED *t2,int t2_current_subtree
          )

{
  int currentSubtreeSize;
  int pathIDWithPathIDOffset;
  int iVar1;
  int iVar2;
  const_reference pvVar3;
  double *pdVar4;
  const_reference pvVar5;
  size_type sVar6;
  int local_90;
  int child_1;
  int j;
  int l;
  value_type *ai1;
  int local_78;
  int child;
  int i;
  int k;
  value_type *ai;
  int parent;
  int pathIDOffset;
  int currentPathNode;
  int strategyPathType;
  int strategyPathID;
  double result;
  int subtreeSize2;
  int subtreeSize1;
  int currentSubtree2;
  int currentSubtree1;
  int t2_current_subtree_local;
  TreeIndexAPTED *t2_local;
  int t1_current_subtree_local;
  TreeIndexAPTED *t1_local;
  APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED> *this_local;
  
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&(t1->super_PreLToSize).prel_to_size_,(long)t1_current_subtree);
  iVar2 = *pvVar3;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&(t2->super_PreLToSize).prel_to_size_,(long)t2_current_subtree);
  currentSubtreeSize = *pvVar3;
  if ((iVar2 == 1) || (currentSubtreeSize == 1)) {
    this_local = (APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
                  *)spf1(this,t1,t1_current_subtree,t2,t2_current_subtree);
  }
  else {
    pdVar4 = data_structures::Matrix<double>::read_at
                       (&this->delta_,(long)t1_current_subtree,(long)t2_current_subtree);
    pathIDWithPathIDOffset = (int)*pdVar4;
    iVar1 = pathIDWithPathIDOffset;
    if (pathIDWithPathIDOffset < 1) {
      iVar1 = -pathIDWithPathIDOffset;
    }
    parent = iVar1 + -1;
    iVar1 = (t1->super_Constants).tree_size_;
    if (parent < iVar1) {
      iVar2 = get_strategy_path_type(this,pathIDWithPathIDOffset,iVar1,t1_current_subtree,iVar2);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(t1->super_PreLToParent).prel_to_parent_,(long)parent);
      ai._4_4_ = *pvVar3;
      while (t1_current_subtree <= ai._4_4_) {
        pvVar5 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&(t1->super_PreLToChildren).prel_to_children_,(long)ai._4_4_);
        sVar6 = std::vector<int,_std::allocator<int>_>::size(pvVar5);
        for (local_78 = 0; local_78 < (int)sVar6; local_78 = local_78 + 1) {
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(long)local_78);
          if (*pvVar3 != parent) {
            gted(this,t1,*pvVar3,t2,t2_current_subtree);
          }
        }
        parent = ai._4_4_;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&(t1->super_PreLToParent).prel_to_parent_,(long)ai._4_4_);
        ai._4_4_ = *pvVar3;
      }
      if (iVar2 == 0) {
        this_local = (APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
                      *)spfL(this,t1,t1_current_subtree,t2,t2_current_subtree,false);
      }
      else if (iVar2 == 1) {
        this_local = (APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
                      *)spfR(this,t1,t1_current_subtree,t2,t2_current_subtree,false);
      }
      else {
        if (pathIDWithPathIDOffset < 1) {
          pathIDWithPathIDOffset = -pathIDWithPathIDOffset;
        }
        this_local = (APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
                      *)spfA(this,t1,t1_current_subtree,t2,t2_current_subtree,
                             pathIDWithPathIDOffset + -1,iVar2,false);
      }
    }
    else {
      parent = parent - iVar1;
      iVar2 = get_strategy_path_type
                        (this,pathIDWithPathIDOffset,iVar1,t2_current_subtree,currentSubtreeSize);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(t2->super_PreLToParent).prel_to_parent_,(long)parent);
      ai._4_4_ = *pvVar3;
      while (t2_current_subtree <= ai._4_4_) {
        pvVar5 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&(t2->super_PreLToChildren).prel_to_children_,(long)ai._4_4_);
        sVar6 = std::vector<int,_std::allocator<int>_>::size(pvVar5);
        for (local_90 = 0; local_90 < (int)sVar6; local_90 = local_90 + 1) {
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar5,(long)local_90);
          if (*pvVar3 != parent) {
            gted(this,t1,t1_current_subtree,t2,*pvVar3);
          }
        }
        parent = ai._4_4_;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&(t2->super_PreLToParent).prel_to_parent_,(long)ai._4_4_);
        ai._4_4_ = *pvVar3;
      }
      if (iVar2 == 0) {
        this_local = (APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
                      *)spfL(this,t2,t2_current_subtree,t1,t1_current_subtree,true);
      }
      else if (iVar2 == 1) {
        this_local = (APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
                      *)spfR(this,t2,t2_current_subtree,t1,t1_current_subtree,true);
      }
      else {
        if (pathIDWithPathIDOffset < 1) {
          pathIDWithPathIDOffset = -pathIDWithPathIDOffset;
        }
        this_local = (APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
                      *)spfA(this,t2,t2_current_subtree,t1,t1_current_subtree,
                             (pathIDWithPathIDOffset - iVar1) + -1,iVar2,true);
      }
    }
  }
  return (double)this_local;
}

Assistant:

double APTEDTreeIndex<CostModel, TreeIndex>::gted(const TreeIndex& t1,
    int t1_current_subtree, const TreeIndex& t2,
    int t2_current_subtree) {
  const int currentSubtree1 = t1_current_subtree;
  const int currentSubtree2 = t2_current_subtree;
  const int subtreeSize1 = t1.prel_to_size_[currentSubtree1];
  const int subtreeSize2 = t2.prel_to_size_[currentSubtree2];

  // std::cout << "gted(" << currentSubtree1 << "," << currentSubtree2 << ")" << std::endl;

  double result = 0;

  // Use spf1.
  if ((subtreeSize1 == 1 || subtreeSize2 == 1)) {
    result = spf1(t1, currentSubtree1, t2, currentSubtree2);
    // std::cerr << "spf1(" << currentSubtree1 << "," << currentSubtree2 << ") = " << result << std::endl;
    return result;
  }

  int strategyPathID = static_cast<int>(delta_.read_at(currentSubtree1, currentSubtree2));

  int strategyPathType = -1;
  int currentPathNode = std::abs(strategyPathID) - 1;
  int pathIDOffset = t1.tree_size_;

  int parent = -1;
  if(currentPathNode < pathIDOffset) {
    strategyPathType = get_strategy_path_type(strategyPathID, pathIDOffset, currentSubtree1, subtreeSize1);
    parent = t1.prel_to_parent_[currentPathNode];
    while(parent >= currentSubtree1) {
      auto& ai = t1.prel_to_children_[parent];
      int k = ai.size();
      for(int i = 0; i < k; ++i) {
        int child = ai[i];
        if(child != currentPathNode) {
          // t1.set_current_node(child);
          gted(t1, child, t2, t2_current_subtree);
        }
      }
      currentPathNode = parent;
      parent = t1.prel_to_parent_[currentPathNode];
    }
    // TODO: Move this property away from node indexer and pass directly to spfs.
    // t1.set_current_node(currentSubtree1);

    // Pass to spfs a boolean that says says if the order of input subtrees
    // has been swapped compared to the order of the initial input trees.
    // Used for accessing delta array and deciding on the edit operation
    // [1, Section 3.4].
    if (strategyPathType == 0) {
      result = spfL(t1, t1_current_subtree, t2, t2_current_subtree, false);
      // std::cerr << "spfL(" << t1_current_subtree << "," << t2_current_subtree << ") = " << result << std::endl;
      return result;
    }
    if (strategyPathType == 1) {
      result = spfR(t1, t1_current_subtree, t2, t2_current_subtree, false);
      // std::cerr << "spfR(" << t1_current_subtree << "," << t2_current_subtree << ") = " << result << std::endl;
      return result;
    }
    result = spfA(t1, t1_current_subtree, t2, t2_current_subtree,
        std::abs(strategyPathID) - 1, strategyPathType, false);
    // std::cerr << "spfA(" << t1_current_subtree << "," << t2_current_subtree << ") = " << result << std::endl;
    return result;
  }

  currentPathNode -= pathIDOffset;
  strategyPathType = get_strategy_path_type(strategyPathID, pathIDOffset, currentSubtree2, subtreeSize2);
  parent = t2.prel_to_parent_[currentPathNode];
  while(parent >= currentSubtree2) {
    // std::cerr << "parent = " << parent << std::endl;
    // std::cerr << "# parent's children = " << t2.prel_to_children_[parent].size() << std::endl;
    auto& ai1 = t2.prel_to_children_[parent];
    int l = ai1.size();
    for(int j = 0; j < l; ++j) {
      int child = ai1[j];
      if(child != currentPathNode) {
        // t2.set_current_node(child);
        gted(t1, t1_current_subtree, t2, child);
      }
    }
    currentPathNode = parent;
    parent = t2.prel_to_parent_[currentPathNode];
  }
  // TODO: Move this property away from node indexer and pass directly to spfs.
  // t2.set_current_node(currentSubtree2);

  // Pass to spfs a boolean that says says if the order of input subtrees
  // has been swapped compared to the order of the initial input trees. Used
  // for accessing delta array and deciding on the edit operation
  // [1, Section 3.4].
  if (strategyPathType == 0) {
    result = spfL(t2, t2_current_subtree, t1, t1_current_subtree, true);
    // std::cerr << "spfL(" << t1_current_subtree << "," << t2_current_subtree << ") = " << result << std::endl;
    return result;
  }
  if (strategyPathType == 1) {
    result = spfR(t2, t2_current_subtree, t1, t1_current_subtree, true);
    // std::cerr << "spfR(" << t1_current_subtree << "," << t2_current_subtree << ") = " << result << std::endl;
    return result;
  }
  result = spfA(t2, t2_current_subtree, t1, t1_current_subtree,
      std::abs(strategyPathID) - pathIDOffset - 1, strategyPathType, true);
  // std::cerr << "spfA(" << t1_current_subtree << "," << t2_current_subtree << ") = " << result << std::endl;
  return result;
}